

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O0

void __thiscall cmQtAutoGenGlobalInitializer::Keywords::Keywords(Keywords *this)

{
  allocator<char> local_31;
  allocator<char> local_30;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d;
  allocator<char> local_2c;
  allocator<char> local_2b;
  allocator<char> local_2a;
  allocator<char> local_29;
  allocator<char> local_28;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [20];
  allocator<char> local_11;
  Keywords *local_10;
  Keywords *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,"AUTOMOC",&local_11);
  std::allocator<char>::~allocator(&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->AUTOUIC,"AUTOUIC",local_25);
  std::allocator<char>::~allocator(local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->AUTORCC,"AUTORCC",&local_26);
  std::allocator<char>::~allocator(&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTOMOC_EXECUTABLE,"AUTOMOC_EXECUTABLE",&local_27);
  std::allocator<char>::~allocator(&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTOUIC_EXECUTABLE,"AUTOUIC_EXECUTABLE",&local_28);
  std::allocator<char>::~allocator(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTORCC_EXECUTABLE,"AUTORCC_EXECUTABLE",&local_29);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->SKIP_AUTOGEN,"SKIP_AUTOGEN",&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->SKIP_AUTOMOC,"SKIP_AUTOMOC",&local_2b);
  std::allocator<char>::~allocator(&local_2b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->SKIP_AUTOUIC,"SKIP_AUTOUIC",&local_2c);
  std::allocator<char>::~allocator(&local_2c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->SKIP_AUTORCC,"SKIP_AUTORCC",&local_2d);
  std::allocator<char>::~allocator(&local_2d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTOUIC_OPTIONS,"AUTOUIC_OPTIONS",&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->AUTORCC_OPTIONS,"AUTORCC_OPTIONS",&local_2f);
  std::allocator<char>::~allocator(&local_2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->qrc,"qrc",&local_30);
  std::allocator<char>::~allocator(&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->ui,"ui",&local_31);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::Keywords::Keywords()
  : AUTOMOC("AUTOMOC")
  , AUTOUIC("AUTOUIC")
  , AUTORCC("AUTORCC")
  , AUTOMOC_EXECUTABLE("AUTOMOC_EXECUTABLE")
  , AUTOUIC_EXECUTABLE("AUTOUIC_EXECUTABLE")
  , AUTORCC_EXECUTABLE("AUTORCC_EXECUTABLE")
  , SKIP_AUTOGEN("SKIP_AUTOGEN")
  , SKIP_AUTOMOC("SKIP_AUTOMOC")
  , SKIP_AUTOUIC("SKIP_AUTOUIC")
  , SKIP_AUTORCC("SKIP_AUTORCC")
  , AUTOUIC_OPTIONS("AUTOUIC_OPTIONS")
  , AUTORCC_OPTIONS("AUTORCC_OPTIONS")
  , qrc("qrc")
  , ui("ui")
{
}